

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

float __thiscall nv::KaiserFilter::evaluate(KaiserFilter *this,float x)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar2 = x * 3.1415927 * this->stretch;
  if (0.0001 <= ABS(fVar2)) {
    fVar6 = sinf(fVar2);
    fVar6 = fVar6 / fVar2;
  }
  else {
    fVar6 = ((fVar2 * fVar2) / 120.0 + -0.16666667) * fVar2 * fVar2 + 1.0;
  }
  fVar2 = x / (this->super_Filter).m_width;
  fVar2 = 1.0 - fVar2 * fVar2;
  fVar3 = 0.0;
  if (0.0 <= fVar2) {
    fVar3 = *(float *)&(this->super_Filter).field_0xc;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar5 = 1.0;
    iVar1 = 1;
    fVar4 = 1.0;
    do {
      fVar5 = fVar5 * ((fVar3 * fVar2 * 0.5) / (float)iVar1);
      fVar4 = fVar4 + fVar5 * fVar5;
      iVar1 = iVar1 + 1;
    } while (fVar4 * 1e-06 < fVar5 * fVar5);
    fVar2 = 1.0;
    iVar1 = 1;
    fVar3 = 1.0;
    do {
      fVar2 = fVar2 * ((*(float *)&(this->super_Filter).field_0xc * 0.5) / (float)iVar1);
      fVar3 = fVar3 + fVar2 * fVar2;
      iVar1 = iVar1 + 1;
    } while (fVar3 * 1e-06 < fVar2 * fVar2);
    fVar3 = (fVar6 * fVar4) / fVar3;
  }
  return fVar3;
}

Assistant:

float KaiserFilter::evaluate(float x) const
{
	const float sinc_value = sincf(PI * x * stretch);
	const float t = x / m_width;
	if ((1 - t * t) >= 0) return sinc_value * bessel0(alpha * sqrtf(1 - t * t)) / bessel0(alpha);
	else return 0;
}